

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::ProgramContext::ProgramContext
          (ProgramContext *this,string *vs,string *fs,
          vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
          *attrs,string *desc)

{
  pointer pcVar1;
  
  (this->vertShaderSource)._M_dataplus._M_p = (pointer)&(this->vertShaderSource).field_2;
  pcVar1 = (vs->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + vs->_M_string_length);
  (this->fragShaderSource)._M_dataplus._M_p = (pointer)&(this->fragShaderSource).field_2;
  pcVar1 = (fs->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->fragShaderSource,pcVar1,pcVar1 + fs->_M_string_length);
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::vector(&this->attributes,attrs);
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  pcVar1 = (desc->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar1,pcVar1 + desc->_M_string_length);
  return;
}

Assistant:

ProgramContext (const string& vs, const string& fs, const vector<AttribSpec>& attrs, const string& desc)
			: vertShaderSource(vs), fragShaderSource(fs), attributes(attrs), description(desc) {}